

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O3

TableauPileMouseLeftButtonDownEventData * __thiscall
solitaire::events::EventsProcessor::getTableauPileMouseLeftButtonDownEventData
          (TableauPileMouseLeftButtonDownEventData *__return_storage_ptr__,EventsProcessor *this,
          PileId *id,uint cardIndex)

{
  int iVar1;
  undefined4 extraout_var;
  TableauPile *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Solitaire *pSVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->context->_vptr_Context[4])();
  pSVar2 = (Solitaire *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*pSVar2->_vptr_Solitaire[0xe])(pSVar2);
  pTVar3 = (TableauPile *)CONCAT44(extraout_var_00,iVar1);
  __return_storage_ptr__->solitaire = pSVar2;
  __return_storage_ptr__->pile = pTVar3;
  iVar1 = (*this->context->_vptr_Context[8])();
  __return_storage_ptr__->collider = (TableauPileCollider *)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*(pTVar3->super_Archiver)._vptr_Archiver[7])(pTVar3);
  __return_storage_ptr__->cardsQuantity =
       (uint)((ulong)(((long *)CONCAT44(extraout_var_02,iVar1))[1] -
                     *(long *)CONCAT44(extraout_var_02,iVar1)) >> 3);
  __return_storage_ptr__->cardIndex = cardIndex;
  return __return_storage_ptr__;
}

Assistant:

EventsProcessor::TableauPileMouseLeftButtonDownEventData
EventsProcessor::getTableauPileMouseLeftButtonDownEventData(
    const PileId id, const unsigned cardIndex) const
{
    auto& solitaire = context.getSolitaire();
    auto& tableauPile = solitaire.getTableauPile(id);

    return TableauPileMouseLeftButtonDownEventData {
        solitaire,
        tableauPile,
        context.getTableauPileCollider(id),
        static_cast<unsigned>(tableauPile.getCards().size()),
        cardIndex
    };
}